

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,DryHandler *handler)

{
  Ch *pCVar1;
  
  pCVar1 = is->src_;
  if (*pCVar1 == 'n') {
    is->src_ = pCVar1 + 1;
    if (((pCVar1[1] == 'u') && (is->src_ = pCVar1 + 2, pCVar1[2] == 'l')) &&
       (is->src_ = pCVar1 + 3, pCVar1[3] == 'l')) {
      is->src_ = pCVar1 + 4;
    }
    else {
      ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>();
    }
    return;
  }
  __assert_fail("is.Peek() == \'n\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                ,0x357,
                "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNull(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
               );
}

Assistant:

void ParseNull(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 'n');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'u') && Consume(is, 'l') && Consume(is, 'l'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Null()))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }